

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O1

BOOL __thiscall
Js::ModuleRoot::SetProperty
          (ModuleRoot *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  HostObjectBase *pHVar1;
  PropertyIndex PVar2;
  int iVar3;
  BOOL BVar4;
  BOOL BVar5;
  BOOL local_38;
  PropertyOperationFlags local_34;
  BOOL setAttempted;
  
  local_34 = flags;
  PVar2 = DynamicObject::GetPropertyIndex((DynamicObject *)this,propertyId);
  if (PVar2 == 0xffff) {
    pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
    if ((pHVar1 != (HostObjectBase *)0x0) &&
       (iVar3 = (**(code **)(*(long *)pHVar1 + 0x58))(pHVar1,propertyId,0), iVar3 == 1)) {
      pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
      BVar4 = (**(code **)(*(long *)pHVar1 + 0xb8))(pHVar1,propertyId,value,local_34,0);
      return BVar4;
    }
    local_38 = 1;
    BVar4 = GlobalObject::SetExistingProperty
                      ((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                           type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       globalObject.ptr,propertyId,value,(PropertyValueInfo *)0x0,&local_38);
    BVar5 = 1;
    if ((BVar4 == 0) && (BVar5 = 0, local_38 == 0)) {
      BVar5 = DynamicObject::SetProperty((DynamicObject *)this,propertyId,value,local_34,info);
    }
  }
  else {
    iVar3 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x30])(this,(ulong)(uint)propertyId);
    if (iVar3 == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode
                (local_34,(((((this->super_RootObjectBase).super_DynamicObject.
                              super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                          super_JavascriptLibraryBase).scriptContext.ptr);
      iVar3 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x23])(this,(ulong)(uint)propertyId);
      if (iVar3 == 0) {
        if (info == (PropertyValueInfo *)0x0) {
          return 0;
        }
        info->m_instance = (RecyclableObject *)this;
        info->m_propertyIndex = PVar2;
        info->m_attributes = '\0';
        info->flags = InlineCacheNoFlags;
        return 0;
      }
      BVar5 = 0;
    }
    else {
      DynamicObject::SetSlot((DynamicObject *)this,propertyId,false,(uint)PVar2,value);
      iVar3 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x23])(this,(ulong)(uint)propertyId);
      if (iVar3 == 0) {
        if (info == (PropertyValueInfo *)0x0) {
          return 1;
        }
        info->m_instance = (RecyclableObject *)this;
        info->m_propertyIndex = PVar2;
        info->m_attributes = '\x04';
        info->flags = InlineCacheNoFlags;
        return 1;
      }
      BVar5 = 1;
    }
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
  }
  return BVar5;
}

Assistant:

BOOL ModuleRoot::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        PropertyIndex index = GetPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
            if (this->IsWritable(propertyId) == FALSE)
            {
                JavascriptError::ThrowCantAssignIfStrictMode(flags, this->GetScriptContext());

#if ENABLE_FIXED_FIELDS
                if (this->IsFixedProperty(propertyId))
                {
                    PropertyValueInfo::SetNoCache(info, this);
                }
                else
#endif
                {
                    PropertyValueInfo::Set(info, this, index, PropertyNone); // Try to cache property info even if not writable
                }
                return FALSE;
            }
            this->SetSlot(SetSlotArguments(propertyId, index, value));
#if ENABLE_FIXED_FIELDS
            if (this->IsFixedProperty(propertyId))
            {
                PropertyValueInfo::SetNoCache(info, this);
            }
            else
#endif
            {
                PropertyValueInfo::Set(info, this, index);
            }
            return TRUE;
        }
        else if (this->hostObject && this->hostObject->HasProperty(propertyId))
        {
            return this->hostObject->SetProperty(propertyId, value, flags, NULL);
        }

        //
        // Try checking the global object
        // if the module root doesn't have the property and the host object also doesn't have it
        //
        GlobalObject* globalObj = this->GetLibrary()->GetGlobalObject();
        BOOL setAttempted = TRUE;
        if (globalObj->SetExistingProperty(propertyId, value, NULL, &setAttempted))
        {
            return TRUE;
        }

        //
        // Set was attempted. But the set operation returned false.
        // This happens, when the property is read only.
        // In those scenarios, we should be setting the property with default attributes
        //
        if (setAttempted)
        {
            return FALSE;
        }

        return DynamicObject::SetProperty(propertyId, value, flags, info);
    }